

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O3

void __thiscall QDomNamedNodeMapPrivate::clearMap(QDomNamedNodeMapPrivate *this)

{
  int *piVar1;
  byte bVar2;
  Data *pDVar3;
  Span *pSVar4;
  ulong uVar5;
  long *plVar6;
  uchar *puVar7;
  ulong uVar8;
  
  if ((this->appendToParent == false) && (pDVar3 = (this->map).d, pDVar3 != (Data *)0x0)) {
    pSVar4 = pDVar3->spans;
    if (pSVar4->offsets[0] == 0xff) {
      uVar5 = 1;
      do {
        uVar8 = uVar5;
        if (pDVar3->numBuckets == uVar8) goto LAB_00110296;
        uVar5 = uVar8 + 1;
      } while (pSVar4[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
    }
    else {
      uVar8 = 0;
    }
    puVar7 = pSVar4[uVar8 >> 7].entries[pSVar4[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f]].storage.data
             + 0x18;
    do {
      do {
        LOCK();
        piVar1 = (int *)(**(long **)puVar7 + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        plVar6 = *(long **)puVar7;
        if ((*piVar1 == 0) && ((long *)*plVar6 != (long *)0x0)) {
          (**(code **)(*(long *)*plVar6 + 8))();
          plVar6 = *(long **)puVar7;
        }
        puVar7 = (uchar *)(plVar6 + 1);
      } while (plVar6[1] != 0);
      do {
        if (pDVar3->numBuckets - 1 == uVar8) goto LAB_00110296;
        uVar8 = uVar8 + 1;
        bVar2 = pDVar3->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f];
      } while (bVar2 == 0xff);
      puVar7 = pDVar3->spans[uVar8 >> 7].entries[bVar2].storage.data + 0x18;
    } while( true );
  }
LAB_00110296:
  QMultiHash<QString,_QDomNodePrivate_*>::clear(&this->map);
  return;
}

Assistant:

void QDomNamedNodeMapPrivate::clearMap()
{
    // Dereference all of our children if we took references
    if (!appendToParent) {
        auto it = map.constBegin();
        for (; it != map.constEnd(); ++it)
            if (!it.value()->ref.deref())
                delete it.value();
    }
    map.clear();
}